

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O0

void ihevc_itrans_4x4(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                     WORD32 i4_shift,WORD32 zero_cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  undefined2 *in_RSI;
  short *in_RDI;
  byte in_R8B;
  uint in_R9D;
  WORD32 add;
  WORD32 o [2];
  WORD32 e [2];
  WORD32 j;
  undefined2 local_58;
  undefined2 local_54;
  undefined2 local_50;
  undefined2 local_4c;
  undefined2 local_48;
  undefined2 local_44;
  undefined2 local_40;
  undefined2 local_3c;
  int local_24;
  uint local_20;
  undefined2 *local_10;
  short *local_8;
  
  iVar1 = 1 << (in_R8B - 1 & 0x1f);
  local_20 = in_R9D;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if ((local_20 & 1) == 1) {
      memset(local_10,0,8);
    }
    else {
      iVar2 = local_8[in_EDX] * 0x53 + local_8[in_EDX * 3] * 0x24;
      iVar3 = local_8[in_EDX] * 0x24 + local_8[in_EDX * 3] * -0x53;
      iVar4 = *local_8 * 0x40 + local_8[in_EDX << 1] * 0x40;
      iVar5 = *local_8 * 0x40 + local_8[in_EDX << 1] * -0x40;
      if (iVar4 + iVar2 + iVar1 >> (in_R8B & 0x1f) < 0x8000) {
        if (iVar4 + iVar2 + iVar1 >> (in_R8B & 0x1f) < -0x8000) {
          local_40 = 0x8000;
        }
        else {
          local_40 = (undefined2)(iVar4 + iVar2 + iVar1 >> (in_R8B & 0x1f));
        }
        local_3c = local_40;
      }
      else {
        local_3c = 0x7fff;
      }
      *local_10 = local_3c;
      if (iVar5 + iVar3 + iVar1 >> (in_R8B & 0x1f) < 0x8000) {
        if (iVar5 + iVar3 + iVar1 >> (in_R8B & 0x1f) < -0x8000) {
          local_48 = 0x8000;
        }
        else {
          local_48 = (undefined2)(iVar5 + iVar3 + iVar1 >> (in_R8B & 0x1f));
        }
        local_44 = local_48;
      }
      else {
        local_44 = 0x7fff;
      }
      local_10[1] = local_44;
      if ((iVar5 - iVar3) + iVar1 >> (in_R8B & 0x1f) < 0x8000) {
        if ((iVar5 - iVar3) + iVar1 >> (in_R8B & 0x1f) < -0x8000) {
          local_50 = 0x8000;
        }
        else {
          local_50 = (undefined2)((iVar5 - iVar3) + iVar1 >> (in_R8B & 0x1f));
        }
        local_4c = local_50;
      }
      else {
        local_4c = 0x7fff;
      }
      local_10[2] = local_4c;
      if ((iVar4 - iVar2) + iVar1 >> (in_R8B & 0x1f) < 0x8000) {
        if ((iVar4 - iVar2) + iVar1 >> (in_R8B & 0x1f) < -0x8000) {
          local_58 = 0x8000;
        }
        else {
          local_58 = (undefined2)((iVar4 - iVar2) + iVar1 >> (in_R8B & 0x1f));
        }
        local_54 = local_58;
      }
      else {
        local_54 = 0x7fff;
      }
      local_10[3] = local_54;
    }
    local_8 = local_8 + 1;
    local_10 = local_10 + in_ECX;
    local_20 = (int)local_20 >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_4x4(WORD16 *pi2_src,
                      WORD16 *pi2_dst,
                      WORD32 src_strd,
                      WORD32 dst_strd,
                      WORD32 i4_shift,
                      WORD32 zero_cols)
{
    WORD32 j;
    WORD32 e[2], o[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_4; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_4 * sizeof(WORD16));
        }
        else
        {

            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            o[0] = g_ai2_ihevc_trans_4[1][0] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][0] * pi2_src[3 * src_strd];
            o[1] = g_ai2_ihevc_trans_4[1][1] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][1] * pi2_src[3 * src_strd];
            e[0] = g_ai2_ihevc_trans_4[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][0] * pi2_src[2 * src_strd];
            e[1] = g_ai2_ihevc_trans_4[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][1] * pi2_src[2 * src_strd];

            pi2_dst[0] =
                            CLIP_S16(((e[0] + o[0] + add) >> i4_shift));
            pi2_dst[1] =
                            CLIP_S16(((e[1] + o[1] + add) >> i4_shift));
            pi2_dst[2] =
                            CLIP_S16(((e[1] - o[1] + add) >> i4_shift));
            pi2_dst[3] =
                            CLIP_S16(((e[0] - o[0] + add) >> i4_shift));

        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}